

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

int SUNSparseMatrix_Realloc(SUNMatrix A)

{
  int iVar1;
  SUNMatrix_ID SVar2;
  void *pvVar3;
  SUNMatrix in_RDI;
  sunindextype nzmax;
  int local_4;
  
  SVar2 = SUNMatGetID(in_RDI);
  if (SVar2 == SUNMATRIX_SPARSE) {
    iVar1 = *(int *)(*(long *)((long)in_RDI->content + 0x28) +
                    (long)*(int *)((long)in_RDI->content + 0xc) * 4);
    if (iVar1 < 0) {
      local_4 = -0x2bd;
    }
    else {
      pvVar3 = realloc(*(void **)((long)in_RDI->content + 0x20),(long)iVar1 << 2);
      *(void **)((long)in_RDI->content + 0x20) = pvVar3;
      pvVar3 = realloc(*(void **)((long)in_RDI->content + 0x10),(long)iVar1 << 3);
      *(void **)((long)in_RDI->content + 0x10) = pvVar3;
      *(int *)((long)in_RDI->content + 8) = iVar1;
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x2bd;
  }
  return local_4;
}

Assistant:

int SUNSparseMatrix_Realloc(SUNMatrix A)
{
  sunindextype nzmax;

  /* check for valid matrix type */
  if (SUNMatGetID(A) != SUNMATRIX_SPARSE)
    return SUNMAT_ILL_INPUT;

  /* get total number of nonzeros (return with failure if illegal) */
  nzmax = (SM_INDEXPTRS_S(A))[SM_NP_S(A)];
  if (nzmax < 0) return SUNMAT_ILL_INPUT;

  /* perform reallocation */
  SM_INDEXVALS_S(A) = (sunindextype *) realloc(SM_INDEXVALS_S(A), nzmax*sizeof(sunindextype));
  SM_DATA_S(A) = (realtype *) realloc(SM_DATA_S(A), nzmax*sizeof(realtype));
  SM_NNZ_S(A) = nzmax;

  return SUNMAT_SUCCESS;
}